

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getFreeFloatingMassMatrix
          (KinDynComputations *this,MatrixDynSize *freeFloatingMassMatrix)

{
  bool bVar1;
  long lVar2;
  ulong in_RSI;
  MatrixView<double> *in_stack_00000050;
  KinDynComputations *in_stack_00000058;
  uint in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  MatrixDynSize *in_stack_ffffffffffffff88;
  MatrixView<double> *in_stack_ffffffffffffff90;
  
  lVar2 = iDynTree::Model::getNrOfDOFs();
  iDynTree::Model::getNrOfDOFs();
  iDynTree::MatrixDynSize::resize(in_RSI,lVar2 + 6);
  MatrixView<double>::MatrixView<iDynTree::MatrixDynSize,_0>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (MatrixStorageOrdering *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
  ;
  getFreeFloatingMassMatrix(in_stack_00000058,in_stack_00000050);
  MatrixView<double>::MatrixView<iDynTree::MatrixDynSize,_0>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (MatrixStorageOrdering *)(ulong)in_stack_ffffffffffffff80);
  bVar1 = getFreeFloatingMassMatrix(in_stack_00000058,in_stack_00000050);
  return bVar1;
}

Assistant:

bool KinDynComputations::getFreeFloatingMassMatrix(MatrixDynSize& freeFloatingMassMatrix)
{
    // If the matrix has the right size, this should be inexpensive
    freeFloatingMassMatrix.resize(pimpl->m_robot_model.getNrOfDOFs()+6,pimpl->m_robot_model.getNrOfDOFs()+6);

    this->getFreeFloatingMassMatrix(MatrixView<double>(freeFloatingMassMatrix));

    // Return
    return this->getFreeFloatingMassMatrix(MatrixView<double>(freeFloatingMassMatrix));
}